

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

_Bool array_container_iterate64
                (array_container_t *cont,uint32_t base,roaring_iterator64 iterator,
                uint64_t high_bits,void *ptr)

{
  _Bool _Var1;
  long lVar2;
  bool bVar3;
  
  bVar3 = cont->cardinality < 1;
  if ((0 < cont->cardinality) && (_Var1 = (*iterator)(*cont->array + base | high_bits,ptr), _Var1))
  {
    lVar2 = 1;
    do {
      bVar3 = cont->cardinality <= lVar2;
      if (cont->cardinality <= lVar2) {
        return bVar3;
      }
      _Var1 = (*iterator)(cont->array[lVar2] + base | high_bits,ptr);
      lVar2 = lVar2 + 1;
    } while (_Var1);
  }
  return bVar3;
}

Assistant:

bool array_container_iterate64(const array_container_t *cont, uint32_t base,
                               roaring_iterator64 iterator, uint64_t high_bits,
                               void *ptr) {
    for (int i = 0; i < cont->cardinality; i++)
        if (!iterator(high_bits | (uint64_t)(cont->array[i] + base), ptr))
            return false;
    return true;
}